

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softhsm2-dump-file.cpp
# Opt level: O0

void dump(FILE *stream)

{
  bool bVar1;
  int iVar2;
  FILE *in_RDI;
  vector<AttributeTK<unsigned_long,_unsigned_long,_unsigned_long>,_std::allocator<AttributeTK<unsigned_long,_unsigned_long,_unsigned_long>_>_>
  *in_stack_00000008;
  uint64_t in_stack_00000010;
  FILE *in_stack_00000018;
  uint64_t mech;
  unsigned_long i;
  uint64_t len_2;
  vector<AttributeTK<unsigned_long,_unsigned_long,_unsigned_long>,_std::allocator<AttributeTK<unsigned_long,_unsigned_long,_unsigned_long>_>_>
  value_3;
  uint64_t len_1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> value_2;
  uint64_t len;
  uint64_t value_1;
  uint8_t value;
  uint64_t disktype;
  uint64_t p11type;
  uint64_t gen;
  undefined1 *in_stack_ffffffffffffff38;
  undefined1 inArray;
  undefined4 in_stack_ffffffffffffff40;
  undefined2 in_stack_ffffffffffffff44;
  undefined1 in_stack_ffffffffffffff46;
  undefined1 in_stack_ffffffffffffff47;
  ulong in_stack_ffffffffffffff48;
  allocator_type *in_stack_ffffffffffffff50;
  FILE *in_stack_ffffffffffffff58;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffff60;
  ulong local_98;
  ulong local_90;
  undefined1 local_88 [4];
  int in_stack_ffffffffffffff7c;
  unsigned_long in_stack_ffffffffffffff80;
  undefined1 in_stack_ffffffffffffff8f;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffff90;
  allocator_type local_51 [25];
  ulong local_38;
  long local_20;
  ulong local_18;
  undefined8 local_10;
  FILE *local_8;
  
  local_8 = in_RDI;
  bVar1 = readULong(in_stack_ffffffffffffff58,(uint64_t *)in_stack_ffffffffffffff50);
  if (bVar1) {
    dumpULong(CONCAT17(in_stack_ffffffffffffff47,
                       CONCAT16(in_stack_ffffffffffffff46,
                                CONCAT24(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40))),
              SUB81((ulong)in_stack_ffffffffffffff38 >> 0x38,0));
    printf("generation %lu\n",local_10);
    do {
      while( true ) {
        while( true ) {
          while( true ) {
            while( true ) {
              iVar2 = feof(local_8);
              if (iVar2 != 0) {
                return;
              }
              bVar1 = readULong(in_stack_ffffffffffffff58,(uint64_t *)in_stack_ffffffffffffff50);
              if (!bVar1) {
                corrupt((FILE *)CONCAT17(in_stack_ffffffffffffff47,
                                         CONCAT16(in_stack_ffffffffffffff46,
                                                  CONCAT24(in_stack_ffffffffffffff44,
                                                           in_stack_ffffffffffffff40))));
                return;
              }
              dumpULong(CONCAT17(in_stack_ffffffffffffff47,
                                 CONCAT16(in_stack_ffffffffffffff46,
                                          CONCAT24(in_stack_ffffffffffffff44,
                                                   in_stack_ffffffffffffff40))),
                        SUB81((ulong)in_stack_ffffffffffffff38 >> 0x38,0));
              if ((local_18 & 0xffffffff) == local_18) {
                dumpCKA(in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
                printf("\n");
              }
              else {
                printf("overflow attribute type\n");
              }
              bVar1 = readULong(in_stack_ffffffffffffff58,(uint64_t *)in_stack_ffffffffffffff50);
              if (!bVar1) {
                corrupt((FILE *)CONCAT17(in_stack_ffffffffffffff47,
                                         CONCAT16(in_stack_ffffffffffffff46,
                                                  CONCAT24(in_stack_ffffffffffffff44,
                                                           in_stack_ffffffffffffff40))));
                return;
              }
              dumpULong(CONCAT17(in_stack_ffffffffffffff47,
                                 CONCAT16(in_stack_ffffffffffffff46,
                                          CONCAT24(in_stack_ffffffffffffff44,
                                                   in_stack_ffffffffffffff40))),
                        SUB81((ulong)in_stack_ffffffffffffff38 >> 0x38,0));
              in_stack_ffffffffffffff58 = (FILE *)(local_20 + -1);
              switch(in_stack_ffffffffffffff58) {
              case (FILE *)0x0:
                printf("boolean attribute\n");
                break;
              case (FILE *)0x1:
                printf("unsigned long attribute\n");
                break;
              case (FILE *)0x2:
                printf("byte string attribute\n");
                break;
              case (FILE *)0x3:
                printf("attribute map attribute\n");
                break;
              case (FILE *)0x4:
                printf("mechanism set attribute\n");
                break;
              default:
                printf("unknown attribute format\n");
              }
              inArray = (undefined1)((ulong)in_stack_ffffffffffffff38 >> 0x38);
              if (local_20 != 1) break;
              bVar1 = readBool(in_stack_ffffffffffffff58,(uint8_t *)in_stack_ffffffffffffff50);
              if (!bVar1) {
                corrupt((FILE *)CONCAT17(in_stack_ffffffffffffff47,
                                         CONCAT16(in_stack_ffffffffffffff46,
                                                  CONCAT24(in_stack_ffffffffffffff44,
                                                           in_stack_ffffffffffffff40))));
                return;
              }
              dumpBool('\0',false);
              printf("\n");
            }
            if (local_20 != 2) break;
            bVar1 = readULong(in_stack_ffffffffffffff58,(uint64_t *)in_stack_ffffffffffffff50);
            if (!bVar1) {
              corrupt((FILE *)CONCAT17(in_stack_ffffffffffffff47,
                                       CONCAT16(in_stack_ffffffffffffff46,
                                                CONCAT24(in_stack_ffffffffffffff44,
                                                         in_stack_ffffffffffffff40))));
              return;
            }
            dumpULong(CONCAT17(in_stack_ffffffffffffff47,
                               CONCAT16(in_stack_ffffffffffffff46,
                                        CONCAT24(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40
                                                ))),
                      SUB81((ulong)in_stack_ffffffffffffff38 >> 0x38,0));
            dumpCKx((uint64_t)in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,
                    CONCAT13(in_stack_ffffffffffffff47,
                             CONCAT12(in_stack_ffffffffffffff46,in_stack_ffffffffffffff44)));
            printf("\n");
          }
          if (local_20 != 3) break;
          bVar1 = readULong(in_stack_ffffffffffffff58,(uint64_t *)in_stack_ffffffffffffff50);
          if (!bVar1) {
            corrupt((FILE *)CONCAT17(in_stack_ffffffffffffff47,
                                     CONCAT16(in_stack_ffffffffffffff46,
                                              CONCAT24(in_stack_ffffffffffffff44,
                                                       in_stack_ffffffffffffff40))));
            return;
          }
          dumpULong(CONCAT17(in_stack_ffffffffffffff47,
                             CONCAT16(in_stack_ffffffffffffff46,
                                      CONCAT24(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40))
                            ),SUB81((ulong)in_stack_ffffffffffffff38 >> 0x38,0));
          if (0x3fffffff < local_38) {
            printf("overflow length...\n");
            return;
          }
          printf("(length %lu)\n",local_38);
          in_stack_ffffffffffffff50 = local_51;
          in_stack_ffffffffffffff48 = local_38;
          std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)0x109d16);
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                    (in_stack_ffffffffffffff60,(size_type)in_stack_ffffffffffffff58,
                     in_stack_ffffffffffffff50);
          std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x109d36);
          bVar1 = readBytes(in_stack_ffffffffffffff58,
                            (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                            in_stack_ffffffffffffff50);
          in_stack_ffffffffffffff47 = bVar1;
          if (bVar1) {
            dumpBytes(in_stack_ffffffffffffff90,(bool)in_stack_ffffffffffffff8f);
          }
          else {
            corrupt((FILE *)CONCAT17(bVar1,CONCAT16(in_stack_ffffffffffffff46,
                                                    CONCAT24(in_stack_ffffffffffffff44,
                                                             in_stack_ffffffffffffff40))));
          }
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                     in_stack_ffffffffffffff50);
          if (!bVar1) {
            return;
          }
        }
        if (local_20 == 4) break;
        if (local_20 != 5) {
          corrupt((FILE *)CONCAT17(in_stack_ffffffffffffff47,
                                   CONCAT16(in_stack_ffffffffffffff46,
                                            CONCAT24(in_stack_ffffffffffffff44,
                                                     in_stack_ffffffffffffff40))));
          return;
        }
        bVar1 = readULong(in_stack_ffffffffffffff58,(uint64_t *)in_stack_ffffffffffffff50);
        if (!bVar1) {
          corrupt((FILE *)CONCAT17(in_stack_ffffffffffffff47,
                                   CONCAT16(in_stack_ffffffffffffff46,
                                            CONCAT24(in_stack_ffffffffffffff44,
                                                     in_stack_ffffffffffffff40))));
          return;
        }
        dumpULong(CONCAT17(in_stack_ffffffffffffff47,
                           CONCAT16(in_stack_ffffffffffffff46,
                                    CONCAT24(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40))),
                  SUB81((ulong)in_stack_ffffffffffffff38 >> 0x38,0));
        if (0x3fffffff < local_90) {
          printf("overflow length...\n");
          return;
        }
        printf("(length %lu)\n",local_90);
        for (local_98 = 0; local_98 < local_90; local_98 = local_98 + 1) {
          bVar1 = readULong(in_stack_ffffffffffffff58,(uint64_t *)in_stack_ffffffffffffff50);
          if (!bVar1) {
            corrupt((FILE *)CONCAT17(in_stack_ffffffffffffff47,
                                     CONCAT16(in_stack_ffffffffffffff46,
                                              CONCAT24(in_stack_ffffffffffffff44,
                                                       in_stack_ffffffffffffff40))));
            return;
          }
          dumpULong(CONCAT17(in_stack_ffffffffffffff47,
                             CONCAT16(in_stack_ffffffffffffff46,
                                      CONCAT24(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40))
                            ),SUB81((ulong)in_stack_ffffffffffffff38 >> 0x38,0));
          dumpCKM(in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
          printf("\n");
        }
      }
      bVar1 = readULong(in_stack_ffffffffffffff58,(uint64_t *)in_stack_ffffffffffffff50);
      if (!bVar1) {
        corrupt((FILE *)CONCAT17(in_stack_ffffffffffffff47,
                                 CONCAT16(in_stack_ffffffffffffff46,
                                          CONCAT24(in_stack_ffffffffffffff44,
                                                   in_stack_ffffffffffffff40))));
        return;
      }
      dumpULong(CONCAT17(in_stack_ffffffffffffff47,
                         CONCAT16(in_stack_ffffffffffffff46,
                                  CONCAT24(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40))),
                (bool)inArray);
      if ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x3fffffff <
          in_stack_ffffffffffffff90) {
        printf("overflow length...\n");
        return;
      }
      printf("(length %lu)\n",in_stack_ffffffffffffff90);
      in_stack_ffffffffffffff38 = local_88;
      std::
      vector<AttributeTK<unsigned_long,_unsigned_long,_unsigned_long>,_std::allocator<AttributeTK<unsigned_long,_unsigned_long,_unsigned_long>_>_>
      ::vector((vector<AttributeTK<unsigned_long,_unsigned_long,_unsigned_long>,_std::allocator<AttributeTK<unsigned_long,_unsigned_long,_unsigned_long>_>_>
                *)0x109e61);
      bVar1 = readMap(in_stack_00000018,in_stack_00000010,in_stack_00000008);
      in_stack_ffffffffffffff46 = bVar1;
      if (bVar1) {
        dumpMap((va_type *)
                CONCAT17(in_stack_ffffffffffffff47,
                         CONCAT16(bVar1,CONCAT24(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40
                                                ))));
      }
      else {
        corrupt((FILE *)CONCAT17(in_stack_ffffffffffffff47,
                                 CONCAT16(bVar1,CONCAT24(in_stack_ffffffffffffff44,
                                                         in_stack_ffffffffffffff40))));
      }
      std::
      vector<AttributeTK<unsigned_long,_unsigned_long,_unsigned_long>,_std::allocator<AttributeTK<unsigned_long,_unsigned_long,_unsigned_long>_>_>
      ::~vector((vector<AttributeTK<unsigned_long,_unsigned_long,_unsigned_long>,_std::allocator<AttributeTK<unsigned_long,_unsigned_long,_unsigned_long>_>_>
                 *)in_stack_ffffffffffffff50);
    } while (bVar1);
  }
  else {
    iVar2 = feof(local_8);
    if (iVar2 == 0) {
      corrupt((FILE *)CONCAT17(in_stack_ffffffffffffff47,
                               CONCAT16(in_stack_ffffffffffffff46,
                                        CONCAT24(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40
                                                ))));
    }
    else {
      printf("empty file\n");
    }
  }
  return;
}

Assistant:

void dump(FILE* stream)
{
	uint64_t gen;
	if (!readULong(stream, gen))
	{
		if (feof(stream))
		{
			printf("empty file\n");
		}
		else
		{
			corrupt(stream);
		}
		return;
	}
	dumpULong(gen);
	printf("generation %lu\n", (unsigned long) gen);

	while (!feof(stream))
	{
		uint64_t p11type;
		if (!readULong(stream, p11type))
		{
			corrupt(stream);
			return;
		}
		dumpULong(p11type);
		if ((uint64_t)((uint32_t)p11type) != p11type)
		{
			printf("overflow attribute type\n");
		}
		else
		{
			dumpCKA((unsigned long) p11type, 48);
			printf("\n");
		}

		uint64_t disktype;
		if (!readULong(stream, disktype))
		{
			corrupt(stream);
			return;
		}
		dumpULong(disktype);
		switch (disktype)
		{
		case BOOLEAN_ATTR:
			printf("boolean attribute\n");
			break;
		case ULONG_ATTR:
			printf("unsigned long attribute\n");
			break;
		case BYTES_ATTR:
			printf("byte string attribute\n");
			break;
		case ATTRMAP_ATTR:
			printf("attribute map attribute\n");
			break;
		case MECHSET_ATTR:
			printf("mechanism set attribute\n");
			break;
		default:
			printf("unknown attribute format\n");
			break;
		}

		if (disktype == BOOLEAN_ATTR)
		{
			uint8_t value;
			if (!readBool(stream, value))
			{
				corrupt(stream);
				return;
			}
			dumpBool(value);
			printf("\n");
		}
		else if (disktype == ULONG_ATTR)
		{
			uint64_t value;
			if (!readULong(stream, value))
			{
				corrupt(stream);
				return;
			}
			dumpULong(value);
			dumpCKx(p11type, value, 48);
			printf("\n");
		}
		else if (disktype == BYTES_ATTR)
		{
			uint64_t len;
			if (!readULong(stream, len))
			{
				corrupt(stream);
				return;
			}
			dumpULong(len);
			if (len > MAX_BYTES)
			{
				printf("overflow length...\n");
				return;
			}
			printf("(length %lu)\n", (unsigned long) len);

			std::vector<uint8_t> value((size_t) len);
			if (!readBytes(stream, value))
			{
				corrupt(stream);
				return;
			}
			dumpBytes(value);
		}
		else if (disktype == ATTRMAP_ATTR)
		{
			uint64_t len;
			if (!readULong(stream, len))
			{
				corrupt(stream);
				return;
			}
			dumpULong(len);
			if (len > MAX_BYTES)
			{
				printf("overflow length...\n");
				return;
			}
			printf("(length %lu)\n", (unsigned long) len);

			std::vector<Attribute> value;
			if (!readMap(stream, len, value))
			{
				corrupt(stream);
				return;
			}
			dumpMap(value);
		}
		else if (disktype == MECHSET_ATTR)
		{
			uint64_t len;
			if (!readULong(stream, len))
			{
				corrupt(stream);
				return;
			}
			dumpULong(len);
			if (len > MAX_BYTES)
			{
				printf("overflow length...\n");
				return;
			}
			printf("(length %lu)\n", (unsigned long) len);

			for (unsigned long i = 0; i < len; i++)
			{
				uint64_t mech;
				if (!readULong(stream, mech))
				{
					corrupt(stream);
					return;
				}
				dumpULong(mech);
				dumpCKM(mech, 48);
				printf("\n");
			}
		}
		else
		{
			corrupt(stream);
			return;
		}
	}
}